

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O0

int __thiscall QWidgetItem::heightForWidth(QWidgetItem *this,int w)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  QLayout *pQVar7;
  QWidgetPrivate *this_00;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int hfw;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QWidget *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QWidgetPrivate *in_stack_ffffffffffffffa8;
  int local_4c;
  undefined4 uVar8;
  int local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (**(code **)(*in_RDI + 0x40))();
  if ((uVar6 & 1) == 0) {
    local_4c = in_ESI;
    bVar2 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (!bVar2) {
      in_stack_ffffffffffffffa8 = QWidget::d_func((QWidget *)0x345a97);
      QSize::QSize((QSize *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                   in_stack_ffffffffffffff88);
      fromLayoutItemSize(in_stack_ffffffffffffffa8,
                         (QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      local_4c = QSize::width((QSize *)0x345aca);
    }
    uVar8 = 0xaaaaaaaa;
    pQVar7 = QWidget::layout((QWidget *)0x345af6);
    if (pQVar7 == (QLayout *)0x0) {
      iVar3 = (**(code **)(*(long *)in_RDI[2] + 0x80))((long *)in_RDI[2],local_4c);
    }
    else {
      QWidget::layout((QWidget *)0x345b0a);
      iVar3 = QLayout::totalHeightForWidth
                        ((QLayout *)CONCAT44(local_4c,uVar8),(int)((ulong)in_RDI >> 0x20));
    }
    iVar5 = iVar3;
    iVar4 = QWidget::maximumHeight(in_stack_ffffffffffffff90);
    if (iVar4 < iVar3) {
      iVar5 = QWidget::maximumHeight(in_stack_ffffffffffffff90);
    }
    local_2c = iVar5;
    iVar4 = QWidget::minimumHeight(in_stack_ffffffffffffff90);
    if (iVar5 < iVar4) {
      local_2c = QWidget::minimumHeight(in_stack_ffffffffffffff90);
    }
    bVar2 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    if (!bVar2) {
      this_00 = QWidget::d_func((QWidget *)0x345bbf);
      QSize::QSize((QSize *)this_00,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      toLayoutItemSize(in_stack_ffffffffffffffa8,(QSize *)CONCAT44(iVar3,iVar5));
      local_2c = QSize::height((QSize *)0x345bf2);
    }
    if (local_2c < 0) {
      local_2c = 0;
    }
  }
  else {
    local_2c = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

int QWidgetItem::heightForWidth(int w) const
{
    if (isEmpty())
        return -1;

    w = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
      ? fromLayoutItemSize(wid->d_func(), QSize(w, 0)).width()
      : w;

    int hfw;
    if (wid->layout())
        hfw = wid->layout()->totalHeightForWidth(w);
    else
        hfw = wid->heightForWidth(w);

    if (hfw > wid->maximumHeight())
        hfw = wid->maximumHeight();
    if (hfw < wid->minimumHeight())
        hfw = wid->minimumHeight();

    hfw = !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
        ? toLayoutItemSize(wid->d_func(), QSize(0, hfw)).height()
        : hfw;

    if (hfw < 0)
        hfw = 0;
    return hfw;
}